

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyTextToken(Lexer *lexer)

{
  Node *pNVar1;
  
  pNVar1 = (Node *)(*lexer->allocator->vtbl->alloc)(lexer->allocator,0x68);
  pNVar1->parent = (Node *)0x0;
  pNVar1->prev = (Node *)0x0;
  pNVar1->next = (Node *)0x0;
  pNVar1->content = (Node *)0x0;
  pNVar1->last = (Node *)0x0;
  pNVar1->attributes = (AttVal *)0x0;
  pNVar1->was = (Dict *)0x0;
  pNVar1->tag = (Dict *)0x0;
  pNVar1->element = (tmbstr)0x0;
  pNVar1->start = 0;
  pNVar1->end = 0;
  pNVar1->type = RootNode;
  pNVar1->line = 0;
  pNVar1->column = 0;
  pNVar1->closed = no;
  pNVar1->implicit = no;
  pNVar1->linebreak = no;
  if (lexer != (Lexer *)0x0) {
    pNVar1->line = lexer->lines;
    pNVar1->column = lexer->columns;
  }
  pNVar1->type = TextNode;
  pNVar1->start = lexer->txtstart;
  pNVar1->end = lexer->txtend;
  return pNVar1;
}

Assistant:

Node* TY_(TextToken)( Lexer *lexer )
{
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    node->start = lexer->txtstart;
    node->end = lexer->txtend;
    return node;
}